

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::update_piece_priorities
          (torrent *this,vector<download_priority_t,_file_index_t> *file_prios)

{
  byte bVar1;
  element_type *this_00;
  pointer psVar2;
  bool bVar3;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar4;
  int64_t iVar5;
  long lVar6;
  pointer psVar7;
  byte bVar8;
  size_type __n;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> i;
  file_index_t index;
  long lVar9;
  vector<download_priority_t,_piece_index_t> pieces;
  int local_58;
  int local_54;
  vector<download_priority_t,_file_index_t> *local_50;
  _Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  local_48;
  
  __n = (size_type)
        (((this->super_torrent_hot_members).m_torrent_file.
          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files)
        .m_num_pieces;
  if (__n != 0) {
    local_50 = file_prios;
    ::std::
    vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
    ::vector((vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              *)&local_48,__n,(value_type *)&dont_download,(allocator_type *)&local_58);
    this_00 = (this->super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar4 = file_storage::file_range(&this_00->m_files);
    bVar3 = false;
    for (lVar9 = (long)iVar4._begin.m_val.m_val; lVar9 != (long)iVar4 >> 0x20; lVar9 = lVar9 + 1) {
      index.m_val = (int)lVar9;
      iVar5 = file_storage::file_size
                        (&((this->super_torrent_hot_members).m_torrent_file.
                           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->m_files,index);
      if (iVar5 != 0) {
        bVar3 = file_storage::pad_file_at(&this_00->m_files,index);
        psVar7 = (pointer)&dont_download;
        if ((!bVar3) &&
           (psVar2 = (local_50->
                     super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                     ).
                     super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_start, psVar7 = psVar2 + lVar9,
           *(int *)&(local_50->
                    super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                    ).
                    super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (int)psVar2 <= lVar9)) {
          psVar7 = (pointer)&default_priority;
        }
        bVar1 = psVar7->m_val;
        bVar3 = true;
        if (bVar1 != 0) {
          file_piece_range_inclusive((aux *)&local_58,&this_00->m_files,index);
          for (lVar6 = (long)local_54; lVar6 < local_58; lVar6 = lVar6 + 1) {
            bVar8 = local_48._M_impl.super__Vector_impl_data._M_start[lVar6].m_val;
            if (local_48._M_impl.super__Vector_impl_data._M_start[lVar6].m_val <= bVar1) {
              bVar8 = bVar1;
            }
            local_48._M_impl.super__Vector_impl_data._M_start[lVar6].m_val = bVar8;
          }
        }
      }
    }
    if (bVar3) {
      prioritize_pieces(this,(vector<download_priority_t,_piece_index_t> *)&local_48);
    }
    ::std::
    _Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
    ::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

void torrent::update_piece_priorities(
		aux::vector<download_priority_t, file_index_t> const& file_prios)
	{
		INVARIANT_CHECK;

		if (m_torrent_file->num_pieces() == 0) return;

		bool need_update = false;
		// initialize the piece priorities to 0, then only allow
		// setting higher priorities
		aux::vector<download_priority_t, piece_index_t> pieces(aux::numeric_cast<std::size_t>(
			m_torrent_file->num_pieces()), dont_download);
		file_storage const& fs = m_torrent_file->files();
		for (auto const i : fs.file_range())
		{
			std::int64_t const size = m_torrent_file->files().file_size(i);
			if (size == 0) continue;

			// pad files always have priority 0
			download_priority_t const file_prio
				= fs.pad_file_at(i) ? dont_download
				: i >= file_prios.end_index() ? default_priority
				: file_prios[i];

			if (file_prio == dont_download)
			{
				// the pieces already start out as priority 0, no need to update
				// the pieces vector in this case
				need_update = true;
				continue;
			}

			// mark all pieces of the file with this file's priority
			// but only if the priority is higher than the pieces
			// already set (to avoid problems with overlapping pieces)
			auto const [start, end] = file_piece_range_inclusive(fs, i);

			// if one piece spans several files, we might
			// come here several times with the same start_piece, end_piece
			for (piece_index_t p = start; p < end; ++p)
				pieces[p] = std::max(pieces[p], file_prio);

			need_update = true;
		}
		if (need_update) prioritize_pieces(pieces);
	}